

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_rgn_getparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *in)

{
  int iVar1;
  byte local_31;
  jpc_msparms_t *pjStack_30;
  uint_fast8_t tmp;
  jpc_rgn_t *rgn;
  jas_stream_t *in_local;
  jpc_cstate_t *cstate_local;
  jpc_ms_t *ms_local;
  
  pjStack_30 = &ms->parms;
  rgn = (jpc_rgn_t *)in;
  in_local = (jas_stream_t *)cstate;
  cstate_local = (jpc_cstate_t *)ms;
  if (cstate->numcomps < 0x101) {
    iVar1 = jpc_getuint8(in,&local_31);
    if (iVar1 != 0) {
      return -1;
    }
    *(ulong *)pjStack_30 = (ulong)local_31;
  }
  else {
    iVar1 = jpc_getuint16(in,(uint_fast16_t *)&pjStack_30->soc);
    if (iVar1 != 0) {
      return -1;
    }
  }
  iVar1 = jpc_getuint8((jas_stream_t *)rgn,&(pjStack_30->rgn).roisty);
  if ((iVar1 == 0) &&
     (iVar1 = jpc_getuint8((jas_stream_t *)rgn,&(pjStack_30->rgn).roishift), iVar1 == 0)) {
    ms_local._4_4_ = 0;
  }
  else {
    ms_local._4_4_ = -1;
  }
  return ms_local._4_4_;
}

Assistant:

static int jpc_rgn_getparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *in)
{
	jpc_rgn_t *rgn = &ms->parms.rgn;
	uint_fast8_t tmp;
	if (cstate->numcomps <= 256) {
		if (jpc_getuint8(in, &tmp)) {
			return -1;
		}
		rgn->compno = tmp;
	} else {
		if (jpc_getuint16(in, &rgn->compno)) {
			return -1;
		}
	}
	if (jpc_getuint8(in, &rgn->roisty) ||
	  jpc_getuint8(in, &rgn->roishift)) {
		return -1;
	}
	return 0;
}